

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall
Js::TypedArrayBase::SetPropertyWithAttributes
          (TypedArrayBase *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  ScriptContext *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint32 uVar1;
  int iVar2;
  BOOL BVar3;
  PropertyRecord *this_01;
  
  this_00 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
  if (this_01->isNumeric == true) {
    ArrayObject::VerifySetItemAttributes((ArrayObject *)this,propertyId,attributes);
    uVar1 = PropertyRecord::GetNumericValue(this_01);
    UNRECOVERED_JUMPTABLE =
         (this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject[0x29];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(this,(ulong)uVar1,value,0,UNRECOVERED_JUMPTABLE);
    return iVar2;
  }
  if (this_01->isSymbol == false) {
    BVar3 = CanonicalNumericIndexString(propertyId,this_00);
    if (BVar3 != 0) {
      return 0;
    }
  }
  BVar3 = DynamicObject::SetPropertyWithAttributes
                    ((DynamicObject *)this,propertyId,value,attributes,info,flags,
                     possibleSideEffects);
  return BVar3;
}

Assistant:

BOOL TypedArrayBase::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = GetScriptContext();

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            VerifySetItemAttributes(propertyId, attributes);
            return SetItem(propertyRecord->GetNumericValue(), value);
        }

        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return FALSE;
        }

        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }